

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_check_clienthello_tlsext(SSL_HANDSHAKE *hs)

{
  _func_int_SSL_ptr_int_ptr_void_ptr *p_Var1;
  SSL *pSVar2;
  bool bVar3;
  pointer psVar4;
  int local_28;
  int local_24;
  int al;
  int ret;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  _al = hs->ssl;
  local_24 = 3;
  local_28 = 0x70;
  ssl = (SSL *)hs;
  psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&_al->ctx);
  if (psVar4->servername_callback == (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) {
    psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&_al->session_ctx);
    if (psVar4->servername_callback != (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) {
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&_al->session_ctx);
      pSVar2 = _al;
      p_Var1 = psVar4->servername_callback;
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&_al->session_ctx);
      local_24 = (*p_Var1)(pSVar2,&local_28,psVar4->servername_arg);
    }
  }
  else {
    psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&_al->ctx);
    pSVar2 = _al;
    p_Var1 = psVar4->servername_callback;
    psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&_al->ctx);
    local_24 = (*p_Var1)(pSVar2,&local_28,psVar4->servername_arg);
  }
  if (local_24 == 2) {
    ssl_send_alert(_al,2,local_28);
    hs_local._7_1_ = false;
  }
  else if (local_24 == 3) {
    *(uint *)&ssl[10].d1 = *(uint *)&ssl[10].d1 & 0xfffffeff;
    hs_local._7_1_ = true;
  }
  else {
    bVar3 = std::operator!=(&_al->s3->hostname,(nullptr_t)0x0);
    *(uint *)&ssl[10].d1 = *(uint *)&ssl[10].d1 & 0xfffffeff | (uint)bVar3 << 8;
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ssl_check_clienthello_tlsext(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  int ret = SSL_TLSEXT_ERR_NOACK;
  int al = SSL_AD_UNRECOGNIZED_NAME;
  if (ssl->ctx->servername_callback != 0) {
    ret = ssl->ctx->servername_callback(ssl, &al, ssl->ctx->servername_arg);
  } else if (ssl->session_ctx->servername_callback != 0) {
    ret = ssl->session_ctx->servername_callback(
        ssl, &al, ssl->session_ctx->servername_arg);
  }

  switch (ret) {
    case SSL_TLSEXT_ERR_ALERT_FATAL:
      ssl_send_alert(ssl, SSL3_AL_FATAL, al);
      return false;

    case SSL_TLSEXT_ERR_NOACK:
      hs->should_ack_sni = false;
      return true;

    default:
      hs->should_ack_sni = ssl->s3->hostname != nullptr;
      return true;
  }
}